

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ios_prop.h
# Opt level: O3

void booster::locale::impl::ios_prop<propery>::callback(event ev,ios_base *ios,int id)

{
  bool bVar1;
  undefined8 *puVar2;
  long *plVar3;
  undefined4 *puVar4;
  uint uVar5;
  bool bVar6;
  int iVar7;
  
  bVar6 = SUB41(id,0);
  iVar7 = (int)ios;
  if (ev == copyfmt_event) {
    if ((uint)id < *(uint *)(ios + 0xc0)) {
      plVar3 = (long *)((long)id * 0x10 + *(long *)(ios + 200));
    }
    else {
      plVar3 = (long *)std::ios_base::_M_grow_words(iVar7,bVar6);
    }
    if (*plVar3 != -1) {
      if ((uint)id < *(uint *)(ios + 0xc0)) {
        plVar3 = (long *)((long)id * 0x10 + *(long *)(ios + 200));
      }
      else {
        plVar3 = (long *)std::ios_base::_M_grow_words(iVar7,bVar6);
      }
      if (*plVar3 != 0) {
        puVar4 = (undefined4 *)operator_new(4);
        uVar5 = *(uint *)(ios + 0xc0);
        if ((uint)id < uVar5) {
          puVar2 = (undefined8 *)((long)id * 0x10 + *(long *)(ios + 200));
        }
        else {
          puVar2 = (undefined8 *)std::ios_base::_M_grow_words(iVar7,bVar6);
          uVar5 = *(uint *)(ios + 0xc0);
        }
        counter = counter + 1;
        *puVar4 = *(undefined4 *)*puVar2;
        if ((uint)id < uVar5) {
          puVar2 = (undefined8 *)((long)id * 0x10 + *(long *)(ios + 200));
        }
        else {
          puVar2 = (undefined8 *)std::ios_base::_M_grow_words(iVar7,bVar6);
        }
        *puVar2 = puVar4;
      }
    }
  }
  else if (ev == imbue_event) {
    if ((uint)id < *(uint *)(ios + 0xc0)) {
      plVar3 = (long *)((long)id * 0x10 + *(long *)(ios + 200));
    }
    else {
      plVar3 = (long *)std::ios_base::_M_grow_words(iVar7,bVar6);
    }
    if (*plVar3 != -1) {
      if ((uint)id < *(uint *)(ios + 0xc0)) {
        plVar3 = (long *)((long)id * 0x10 + *(long *)(ios + 200));
      }
      else {
        plVar3 = (long *)std::ios_base::_M_grow_words(iVar7,bVar6);
      }
      if (*plVar3 != 0) {
        if (*(uint *)(ios + 0xc0) <= (uint)id) {
          std::ios_base::_M_grow_words(iVar7,bVar6);
        }
        imbued = imbued + 1;
      }
    }
  }
  else if (ev == erase_event) {
    bVar1 = has(ios);
    if (bVar1) {
      if ((uint)id < *(uint *)(ios + 0xc0)) {
        puVar2 = (undefined8 *)((long)id * 0x10 + *(long *)(ios + 200));
      }
      else {
        puVar2 = (undefined8 *)std::ios_base::_M_grow_words(iVar7,bVar6);
      }
      if ((void *)*puVar2 != (void *)0x0) {
        counter = counter + -1;
      }
      operator_delete((void *)*puVar2);
      return;
    }
  }
  return;
}

Assistant:

static void callback(std::ios_base::event ev,std::ios_base &ios,int id)
                {
                    switch(ev) {
                    case std::ios_base::erase_event:
                        if(!has(ios))
                            break;
                        delete reinterpret_cast<Property *>(ios.pword(id));
                        break;
                    case std::ios_base::copyfmt_event:
                        if(ios.pword(id)==invalid || ios.pword(id)==0)
                            break;
                        ios.pword(id)=new Property(*reinterpret_cast<Property *>(ios.pword(id)));
                        break;
                    case std::ios_base::imbue_event:
                        if(ios.pword(id)==invalid || ios.pword(id)==0)
                            break;
                        reinterpret_cast<Property *>(ios.pword(id))->on_imbue(); 
                        break;
                        
                    default: ;
                    }
                }